

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::End(ByteCodeWriter *this)

{
  uint *puVar1;
  Data *this_00;
  uint byteCount;
  ulong uVar2;
  code *pcVar3;
  ByteBlock *pBVar4;
  bool bVar5;
  uint uVar6;
  LocalFunctionId LVar7;
  undefined4 *puVar8;
  ScriptContext *pSVar9;
  byte *byteBuffer;
  Type *pTVar10;
  FunctionBody *pFVar11;
  ByteBlock *pBVar12;
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *jumpOffset;
  ulong uVar13;
  ByteBlock *local_58;
  ByteBlock *finalByteCodeBlock;
  ByteBlock *finalAuxiliaryContextBlock;
  ByteBlock *local_40;
  ByteBlock *finalAuxiliaryBlock;
  
  if (this->isInUse == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x87,"(isInUse)","isInUse");
    if (!bVar5) {
LAB_007c9e7e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  CheckOpen(this);
  Empty(this,EndOfBlock);
  local_58 = (ByteBlock *)0x0;
  pSVar9 = FunctionProxy::GetScriptContext((FunctionProxy *)this->m_functionWrite);
  Data::Copy(&this->m_byteCodeData,pSVar9->recycler,&local_58);
  byteBuffer = ByteBlock::GetBuffer(local_58);
  byteCount = (this->m_byteCodeData).currentOffset;
  jumpOffset = this->m_jumpOffsets;
  if (this->useBranchIsland == true) {
    PatchJumpOffset<short>(this,jumpOffset,byteBuffer,byteCount);
    jumpOffset = this->m_longJumpOffsets;
  }
  PatchJumpOffset<int>(this,jumpOffset,byteBuffer,byteCount);
  uVar6 = FunctionBody::GetRootObjectLoadInlineCacheStart(this->m_functionWrite);
  pBVar12 = (ByteBlock *)&this->rootObjectLoadInlineCacheOffsets;
  finalAuxiliaryContextBlock = (ByteBlock *)this;
  local_40 = pBVar12;
  finalAuxiliaryBlock = pBVar12;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar13 = (ulong)byteCount - 4;
  while( true ) {
    if (pBVar12 == (ByteBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) goto LAB_007c9e7e;
      *puVar8 = 0;
      pBVar12 = finalAuxiliaryBlock;
    }
    pBVar4 = finalAuxiliaryContextBlock;
    if (*(ByteBlock **)pBVar12 == local_40) break;
    finalAuxiliaryBlock = *(ByteBlock **)pBVar12;
    pTVar10 = SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&stack0xffffffffffffffc0);
    uVar2 = *pTVar10;
    if (uVar13 <= uVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0xa9,"(offset < byteCount - sizeof(int))",
                                  "offset < byteCount - sizeof(int)");
      if (!bVar5) goto LAB_007c9e7e;
      *puVar8 = 0;
    }
    *(uint *)(byteBuffer + uVar2) = *(int *)(byteBuffer + uVar2) + uVar6;
    pBVar12 = finalAuxiliaryBlock;
  }
  uVar6 = FunctionBody::GetRootObjectLoadMethodInlineCacheStart
                    ((FunctionBody *)finalAuxiliaryContextBlock[6].m_content.ptr);
  local_40 = (ByteBlock *)&pBVar4[5].m_content;
  finalAuxiliaryBlock = local_40;
  while( true ) {
    if (finalAuxiliaryBlock == (ByteBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) goto LAB_007c9e7e;
      *puVar8 = 0;
    }
    pBVar12 = finalAuxiliaryContextBlock;
    if (*(ByteBlock **)finalAuxiliaryBlock == local_40) break;
    finalAuxiliaryBlock = *(ByteBlock **)finalAuxiliaryBlock;
    pTVar10 = SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&stack0xffffffffffffffc0);
    uVar2 = *pTVar10;
    if (uVar13 <= uVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0xb2,"(offset < byteCount - sizeof(int))",
                                  "offset < byteCount - sizeof(int)");
      if (!bVar5) goto LAB_007c9e7e;
      *puVar8 = 0;
    }
    *(uint *)(byteBuffer + uVar2) = *(int *)(byteBuffer + uVar2) + uVar6;
  }
  uVar6 = FunctionBody::GetRootObjectStoreInlineCacheStart
                    ((FunctionBody *)finalAuxiliaryContextBlock[6].m_content.ptr);
  local_40 = (ByteBlock *)&pBVar12[4].m_content;
  finalAuxiliaryBlock = local_40;
  while( true ) {
    if (finalAuxiliaryBlock == (ByteBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) goto LAB_007c9e7e;
      *puVar8 = 0;
    }
    pBVar12 = finalAuxiliaryContextBlock;
    if (*(ByteBlock **)finalAuxiliaryBlock == local_40) break;
    finalAuxiliaryBlock = *(ByteBlock **)finalAuxiliaryBlock;
    pTVar10 = SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&stack0xffffffffffffffc0);
    uVar2 = *pTVar10;
    if (uVar13 <= uVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0xbb,"(offset < byteCount - sizeof(int))",
                                  "offset < byteCount - sizeof(int)");
      if (!bVar5) goto LAB_007c9e7e;
      *puVar8 = 0;
    }
    *(uint *)(byteBuffer + uVar2) = *(int *)(byteBuffer + uVar2) + uVar6;
  }
  local_40 = (ByteBlock *)0x0;
  finalByteCodeBlock = (ByteBlock *)0x0;
  this_00 = (Data *)(finalAuxiliaryContextBlock + 9);
  pSVar9 = FunctionProxy::GetScriptContext
                     ((FunctionProxy *)finalAuxiliaryContextBlock[6].m_content.ptr);
  Data::Copy(this_00,pSVar9->recycler,&stack0xffffffffffffffc0);
  pSVar9 = FunctionProxy::GetScriptContext((FunctionProxy *)pBVar12[6].m_content.ptr);
  Data::Copy((Data *)(pBVar12 + 0xb),pSVar9->recycler,&finalByteCodeBlock);
  FunctionBody::AllocateInlineCache((FunctionBody *)pBVar12[6].m_content.ptr);
  FunctionBody::AllocateObjectLiteralTypeArray((FunctionBody *)pBVar12[6].m_content.ptr);
  FunctionBody::AllocateForInCache((FunctionBody *)pBVar12[6].m_content.ptr);
  uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)pBVar12[6].m_content.ptr);
  LVar7 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pBVar12[6].m_content.ptr);
  bVar5 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ScriptFunctionWithInlineCachePhase,uVar6,LVar7);
  if (!bVar5) {
    uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)pBVar12[6].m_content.ptr);
    LVar7 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pBVar12[6].m_content.ptr);
    bVar5 = Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineApplyTargetPhase,uVar6,LVar7);
    if (!bVar5) {
      bVar5 = FunctionBody::CanFunctionObjectHaveInlineCaches
                        ((FunctionBody *)pBVar12[6].m_content.ptr);
      if (bVar5) {
        puVar1 = (uint *)(pBVar12[6].m_content.ptr + 0x178);
        *puVar1 = *puVar1 | 0x80000;
      }
    }
  }
  if (pBVar12[0x11].field_0x4 == '\x01') {
    bVar5 = HasLoopWithoutYield((ByteCodeWriter *)pBVar12);
    if (bVar5) {
      pFVar11 = FunctionProxy::GetFunctionBody((FunctionProxy *)pBVar12[6].m_content.ptr);
      if (((pFVar11->super_ParseableFunctionInfo).flags & Flags_HasTry) != Flags_None) {
        uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)pBVar12[6].m_content.ptr);
        LVar7 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pBVar12[6].m_content.ptr);
        bVar5 = Phases::IsEnabled((Phases *)&DAT_01441eb0,JITLoopBodyInTryCatchPhase,uVar6,LVar7);
        if (bVar5) goto LAB_007c9e2c;
      }
      pFVar11 = FunctionProxy::GetFunctionBody((FunctionProxy *)pBVar12[6].m_content.ptr);
      if (pFVar11->m_hasFinally == true) {
        uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)pBVar12[6].m_content.ptr);
        LVar7 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pBVar12[6].m_content.ptr);
        bVar5 = Phases::IsEnabled((Phases *)&DAT_01441eb0,JITLoopBodyInTryFinallyPhase,uVar6,LVar7);
        if (bVar5) goto LAB_007c9e2c;
      }
      AllocateLoopHeaders((ByteCodeWriter *)pBVar12);
    }
  }
LAB_007c9e2c:
  FunctionBody::MarkScript
            ((FunctionBody *)pBVar12[6].m_content.ptr,local_58,local_40,finalByteCodeBlock,
             *(uint *)&pBVar12[0x10].field_0x4,*(uint *)((long)&pBVar12[0x10].m_content.ptr + 4),
             *(uint *)&pBVar12[0x10].m_content.ptr);
  FunctionBody::LoadDynamicProfileInfo((FunctionBody *)pBVar12[6].m_content.ptr);
  Reset((ByteCodeWriter *)pBVar12);
  return;
}

Assistant:

void ByteCodeWriter::End()
#endif
    {
        Assert(isInUse);

        CheckOpen();
        Empty(OpCode::EndOfBlock);

        ByteBlock* finalByteCodeBlock = nullptr;

        ScriptContext* scriptContext = m_functionWrite->GetScriptContext();
        m_byteCodeData.Copy(scriptContext->GetRecycler(), &finalByteCodeBlock);

        byte * byteBuffer = finalByteCodeBlock->GetBuffer();
        uint byteCount = m_byteCodeData.GetCurrentOffset();

        //
        // Update all branch targets with their actual label destinations.
        //
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            PatchJumpOffset<JumpOffset>(m_jumpOffsets, byteBuffer, byteCount);
            PatchJumpOffset<LongJumpOffset>(m_longJumpOffsets, byteBuffer, byteCount);
        }
        else
        {
            PatchJumpOffset<LongJumpOffset>(m_jumpOffsets, byteBuffer, byteCount);
        }
#else
        PatchJumpOffset<JumpOffset>(m_jumpOffsets, byteBuffer, byteCount);
#endif

        // Patch up the root object load inline cache with the start index
        uint rootObjectLoadInlineCacheStart = this->m_functionWrite->GetRootObjectLoadInlineCacheStart();
        rootObjectLoadInlineCacheOffsets.Map([=](size_t offset)
        {
            Assert(offset < byteCount - sizeof(int));
            unaligned uint * pnBackPatch = reinterpret_cast<unaligned uint *>(&byteBuffer[offset]);
            *pnBackPatch += rootObjectLoadInlineCacheStart;
        });

        // Patch up the root object load method inline cache with the start index
        uint rootObjectLoadMethodInlineCacheStart = this->m_functionWrite->GetRootObjectLoadMethodInlineCacheStart();
        rootObjectLoadMethodInlineCacheOffsets.Map([=](size_t offset)
        {
            Assert(offset < byteCount - sizeof(int));
            unaligned uint * pnBackPatch = reinterpret_cast<unaligned uint *>(&byteBuffer[offset]);
            *pnBackPatch += rootObjectLoadMethodInlineCacheStart;
        });

        // Patch up the root object store inline cache with the start index
        uint rootObjectStoreInlineCacheStart = this->m_functionWrite->GetRootObjectStoreInlineCacheStart();
        rootObjectStoreInlineCacheOffsets.Map([=](size_t offset)
        {
            Assert(offset < byteCount - sizeof(int));
            unaligned uint * pnBackPatch = reinterpret_cast<unaligned uint *>(&byteBuffer[offset]);
            *pnBackPatch += rootObjectStoreInlineCacheStart;
        });

        //
        // Store the final trimmed byte-code on the function.
        //
        ByteBlock* finalAuxiliaryBlock = nullptr;
        ByteBlock* finalAuxiliaryContextBlock = nullptr;

        m_auxiliaryData.Copy(m_functionWrite->GetScriptContext()->GetRecycler(), &finalAuxiliaryBlock);
        m_auxContextData.Copy(m_functionWrite->GetScriptContext()->GetRecycler(), &finalAuxiliaryContextBlock);

        m_functionWrite->AllocateInlineCache();
        m_functionWrite->AllocateObjectLiteralTypeArray();
        m_functionWrite->AllocateForInCache();

        if (!PHASE_OFF(Js::ScriptFunctionWithInlineCachePhase, m_functionWrite) && !PHASE_OFF(Js::InlineApplyTargetPhase, m_functionWrite))
        {
            if (m_functionWrite->CanFunctionObjectHaveInlineCaches())
            {
                m_functionWrite->SetInlineCachesOnFunctionObject(true);
            }
        }

        if (this->DoJitLoopBodies() && this->HasLoopWithoutYield() &&
            !(this->m_functionWrite->GetFunctionBody()->GetHasTry() && PHASE_OFF(Js::JITLoopBodyInTryCatchPhase, this->m_functionWrite)) &&
            !(this->m_functionWrite->GetFunctionBody()->GetHasFinally() && PHASE_OFF(Js::JITLoopBodyInTryFinallyPhase, this->m_functionWrite)))
        {
            AllocateLoopHeaders();
        }

        m_functionWrite->MarkScript(finalByteCodeBlock, finalAuxiliaryBlock, finalAuxiliaryContextBlock,
            m_byteCodeCount, m_byteCodeInLoopCount, m_byteCodeWithoutLDACount);

#if ENABLE_PROFILE_INFO
        m_functionWrite->LoadDynamicProfileInfo();
#endif

        JS_ETW(EventWriteJSCRIPT_BYTECODEGEN_METHOD(m_functionWrite->GetHostSourceContext(), m_functionWrite->GetScriptContext(), m_functionWrite->GetLocalFunctionId(), m_functionWrite->GetByteCodeCount(), this->GetTotalSize(), m_functionWrite->GetExternalDisplayName()));

#ifdef LOG_BYTECODE_AST_RATIO
        // log the bytecode AST ratio
        if (currentAstSize == maxAstSize)
        {
            float astBytecodeRatio = (float)currentAstSize / (float)byteCount;
            Output::Print(_u("\tAST Bytecode ratio: %f\n"), astBytecodeRatio);
        }
#endif

        // TODO: add validation for source mapping under #dbg
        //
        // Reset the writer to prepare for the next user.
        //

        Reset();
    }